

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
fasttext::FastText::selectEmbeddings
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,FastText *this,int32_t cutoff)

{
  int *piVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  int32_t iVar2;
  int *piVar3;
  int iVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Whadup[P]weightedFastText_src_fasttext_cc:286:36)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Whadup[P]weightedFastText_src_fasttext_cc:286:36)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Whadup[P]weightedFastText_src_fasttext_cc:286:36)>
  __comp_01;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Whadup[P]weightedFastText_src_fasttext_cc:286:36)>
  __comp_02;
  Vector norms;
  allocator_type local_55;
  int32_t local_54;
  _Vector_base<float,_std::allocator<float>_> local_50;
  value_type_conflict1 local_34;
  
  Vector::Vector((Vector *)&local_50,
                 ((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_);
  Matrix::l2NormRow((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(Vector *)&local_50);
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             ((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->m_,&local_34,&local_55);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar4 = 0;
  for (piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    *piVar3 = iVar4;
    iVar4 = iVar4 + 1;
  }
  local_54 = cutoff;
  iVar2 = Dictionary::getId((this->dict_).
                            super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,(string *)Dictionary::EOS_abi_cxx11_);
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    __comp._M_comp.eosid = iVar2;
    __comp._M_comp.norms = (Vector *)&local_50;
    __comp._M_comp._12_4_ = 0;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
              (__first,__last,
               (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >> 2) *
                            2) ^ 0x7e,__comp);
    if ((long)__last._M_current - (long)__first._M_current < 0x41) {
      __comp_01._M_comp.eosid = iVar2;
      __comp_01._M_comp.norms = (Vector *)&local_50;
      __comp_01._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last,__comp_01);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      __comp_00._M_comp.eosid = iVar2;
      __comp_00._M_comp.norms = (Vector *)&local_50;
      __comp_00._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last_00,__comp_00);
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        __comp_02._M_comp.eosid = iVar2;
        __comp_02._M_comp.norms = (Vector *)&local_50;
        __comp_02._M_comp._12_4_ = 0;
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                  (__last_00,__comp_02);
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::erase
            (__return_storage_ptr__,
             (const_iterator)
             ((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start + local_54),
             (const_iterator)
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> FastText::selectEmbeddings(int32_t cutoff) const {
	Vector norms(input_->size(0));
	input_->l2NormRow(norms);
	std::vector<int32_t> idx(input_->size(0), 0);
	std::iota(idx.begin(), idx.end(), 0);
	auto eosid = dict_->getId(Dictionary::EOS);
	std::sort(idx.begin(), idx.end(), [&norms, eosid](size_t i1, size_t i2) {
		return eosid == i1 || (eosid != i2 && norms[i1] > norms[i2]);
	});
	idx.erase(idx.begin() + cutoff, idx.end());
	return idx;
}